

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

bool __thiscall QThreadPool::tryTake(QThreadPool *this,QRunnable *runnable)

{
  QueuePage *this_00;
  bool bVar1;
  const_iterator o;
  QueuePage **ppQVar2;
  long in_RSI;
  long in_FS_OFFSET;
  add_const_t<QList<QueuePage_*>_> *__range1;
  QThreadPoolPrivate *d;
  QueuePage *page;
  const_iterator __end1;
  const_iterator __begin1;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffff58;
  QRunnable *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  bool local_39;
  const_iterator local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QThreadPool *)0x6cb670);
  if (in_RSI == 0) {
    local_39 = false;
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QMutexLocker<QMutex>::QMutexLocker
              ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_20.i = (QueuePage **)&DAT_aaaaaaaaaaaaaaaa;
    local_20 = QList<QueuePage_*>::begin((QList<QueuePage_*> *)in_stack_ffffffffffffff60);
    o = QList<QueuePage_*>::end((QList<QueuePage_*> *)in_stack_ffffffffffffff60);
    while (bVar1 = QList<QueuePage_*>::const_iterator::operator!=(&local_20,o), bVar1) {
      ppQVar2 = QList<QueuePage_*>::const_iterator::operator*(&local_20);
      this_00 = *ppQVar2;
      bVar1 = QueuePage::tryTake((QueuePage *)
                                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                                 in_stack_ffffffffffffff60);
      if (bVar1) {
        bVar1 = QueuePage::isFinished(this_00);
        if ((bVar1) &&
           (QList<QueuePage*>::removeOne<QueuePage*>
                      ((QList<QueuePage_*> *)in_stack_ffffffffffffff60,
                       (QueuePage **)in_stack_ffffffffffffff58), this_00 != (QueuePage *)0x0)) {
          operator_delete(this_00,0x810);
        }
        local_39 = true;
        goto LAB_006cb837;
      }
      QList<QueuePage_*>::const_iterator::operator++(&local_20);
    }
    local_39 = false;
LAB_006cb837:
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_39;
}

Assistant:

bool QThreadPool::tryTake(QRunnable *runnable)
{
    Q_D(QThreadPool);

    if (runnable == nullptr)
        return false;

    QMutexLocker locker(&d->mutex);
    for (QueuePage *page : std::as_const(d->queue)) {
        if (page->tryTake(runnable)) {
            if (page->isFinished()) {
                d->queue.removeOne(page);
                delete page;
            }
            return true;
        }
    }

    return false;
}